

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::printDisplayLine
          (SPxSolverBase<double> *this,bool force,bool forceHead)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  SPxOut *pSVar5;
  int iVar6;
  char *t;
  double t_00;
  double t_01;
  double t_02;
  double t_03;
  double t_04;
  double t_05;
  double dVar7;
  double dVar8;
  Verbosity old_verbosity;
  undefined4 local_2c;
  
  pSVar5 = this->spxout;
  if (pSVar5 == (SPxOut *)0x0) {
    return;
  }
  old_verbosity = pSVar5->m_verbosity;
  if ((int)old_verbosity < 3) {
    return;
  }
  local_2c = 3;
  (*pSVar5->_vptr_SPxOut[2])();
  if (forceHead) {
LAB_0018afd5:
    soplex::operator<<(this->spxout,
                       "type |   time |   iters | facts |    shift | viol sum | viol num | obj value "
                      );
    if (-1 < this->printBasisMetric) {
      soplex::operator<<(this->spxout," | basis metric");
    }
    std::endl<char,std::char_traits<char>>(this->spxout->m_streams[this->spxout->m_verbosity]);
    if (force) {
      if (forceHead) goto LAB_0018b3e2;
    }
    else {
      iVar4 = this->displayLine;
      iVar6 = this->displayFreq;
LAB_0018b036:
      if (iVar4 % iVar6 != 0 || forceHead) goto LAB_0018b3e2;
    }
  }
  else {
    iVar4 = this->displayLine;
    iVar6 = this->displayFreq;
    if (iVar4 % (iVar6 * 0x1e) == 0) goto LAB_0018afd5;
    if (!force) goto LAB_0018b036;
  }
  t = "  E  |";
  if (this->theType == LEAVE) {
    t = "  L  |";
  }
  soplex::operator<<(this->spxout,t);
  pSVar5 = this->spxout;
  poVar1 = pSVar5->m_streams[pSVar5->m_verbosity];
  lVar2 = *(long *)poVar1;
  *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 1;
  (*this->theTime->_vptr_Timer[6])();
  pSVar5 = soplex::operator<<(pSVar5,t_00);
  soplex::operator<<(pSVar5," |");
  pSVar5 = this->spxout;
  poVar1 = pSVar5->m_streams[pSVar5->m_verbosity];
  lVar2 = *(long *)poVar1;
  *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
  pSVar5 = soplex::operator<<(pSVar5,(this->super_SPxBasisBase<double>).iterCount);
  pSVar5 = soplex::operator<<(pSVar5," | ");
  *(undefined8 *)
   (pSVar5->m_streams[pSVar5->m_verbosity] +
   *(long *)(*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + 0x10) = 5;
  iVar4 = (*((this->super_SPxBasisBase<double>).factor)->_vptr_SLinSolver[0xb])();
  pSVar5 = soplex::operator<<(pSVar5,iVar4);
  pSVar5 = soplex::operator<<(pSVar5," | ");
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
  pSVar5 = soplex::operator<<(pSVar5,t_01);
  pSVar5 = soplex::operator<<(pSVar5," | ");
  dVar8 = this->m_pricingViol + this->m_pricingViolCo;
  dVar7 = 0.0;
  if (0.0 <= dVar8) {
    dVar7 = dVar8;
  }
  pSVar5 = soplex::operator<<(pSVar5,dVar7);
  pSVar5 = soplex::operator<<(pSVar5," | ");
  *(undefined8 *)
   (pSVar5->m_streams[pSVar5->m_verbosity] +
   *(long *)(*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + 0x10) = 8;
  iVar4 = 0;
  if (0 < this->m_numViol) {
    iVar4 = this->m_numViol;
  }
  pSVar5 = soplex::operator<<(pSVar5,iVar4);
  pSVar5 = soplex::operator<<(pSVar5," | ");
  *(undefined8 *)
   (pSVar5->m_streams[pSVar5->m_verbosity] +
   *(long *)(*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) + 8) = 8;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
  soplex::operator<<(pSVar5,t_02);
  iVar4 = this->printBasisMetric;
  if (iVar4 == 0) {
    pSVar5 = soplex::operator<<(this->spxout," | ");
    poVar1 = pSVar5->m_streams[pSVar5->m_verbosity];
    lVar2 = *(long *)poVar1;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar1 + lVar3 + 0x18) = *(uint *)(poVar1 + lVar3 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(this,0);
    soplex::operator<<(pSVar5,t_03);
    iVar4 = this->printBasisMetric;
  }
  if (iVar4 == 1) {
    pSVar5 = soplex::operator<<(this->spxout," | ");
    poVar1 = pSVar5->m_streams[pSVar5->m_verbosity];
    lVar2 = *(long *)poVar1;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar1 + lVar3 + 0x18) = *(uint *)(poVar1 + lVar3 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(this,1);
    soplex::operator<<(pSVar5,t_04);
    iVar4 = this->printBasisMetric;
  }
  if (iVar4 == 2) {
    pSVar5 = soplex::operator<<(this->spxout," | ");
    poVar1 = pSVar5->m_streams[pSVar5->m_verbosity];
    lVar2 = *(long *)poVar1;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar1 + lVar3 + 0x18) = *(uint *)(poVar1 + lVar3 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(this,2);
    soplex::operator<<(pSVar5,t_05);
    iVar4 = this->printBasisMetric;
  }
  if (iVar4 == 3) {
    pSVar5 = soplex::operator<<(this->spxout," | ");
    poVar1 = pSVar5->m_streams[pSVar5->m_verbosity];
    lVar2 = *(long *)poVar1;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar1 + lVar3 + 0x18) = *(uint *)(poVar1 + lVar3 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
    dVar7 = SPxBasisBase<double>::getEstimatedCondition(&this->super_SPxBasisBase<double>);
    soplex::operator<<(pSVar5,dVar7);
  }
  std::endl<char,std::char_traits<char>>(this->spxout->m_streams[this->spxout->m_verbosity]);
LAB_0018b3e2:
  this->displayLine = this->displayLine + 1;
  (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
  return;
}

Assistant:

void SPxSolverBase<R>::printDisplayLine(const bool force, const bool forceHead)
{
   SPX_MSG_INFO1((*this->spxout),

                 if(forceHead || displayLine % (displayFreq * 30) == 0)
{
   (*this->spxout)
            << "type |   time |   iters | facts |    shift | viol sum | viol num | obj value ";

      if(printBasisMetric >= 0)
         (*this->spxout) << " | basis metric";

      (*this->spxout) << std::endl;
   }
   if((force || (displayLine % displayFreq == 0)) && !forceHead)
{
   (type() == LEAVE)
      ? (*this->spxout) << "  L  |" : (*this->spxout) << "  E  |";
      (*this->spxout) << std::fixed << std::setw(7) << std::setprecision(1) << time() << " |";
      (*this->spxout) << std::scientific << std::setprecision(2);
      (*this->spxout) << std::setw(8) << this->iteration() << " | "
                      << std::setw(5) << slinSolver()->getFactorCount() << " | "
                      << shift() << " | "
                      << SOPLEX_MAX(0.0, m_pricingViol + m_pricingViolCo) << " | "
                      << std::setw(8) << SOPLEX_MAX(0, m_numViol) << " | "
                      << std::setprecision(8) << value();

      if(printBasisMetric == 0)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(0);

      if(printBasisMetric == 1)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(1);

      if(printBasisMetric == 2)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(2);

      if(printBasisMetric == 3)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) <<
                         basis().getEstimatedCondition();

      (*this->spxout) << std::endl;
   }